

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O3

WJTL_STATUS TestUnmarshallPartialFills(void)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  long lVar6;
  JL_STATUS JVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  WJTL_STATUS WVar12;
  char *pcVar13;
  byte bVar14;
  _Bool _Var15;
  size_t errorAtPos;
  TheStruct theStruct;
  JlMarshallElement marshalMiniStruct [2];
  size_t local_6f8;
  long local_6f0;
  int local_6e4;
  long local_6e0;
  long local_6d8;
  undefined4 local_6d0;
  char local_6cc;
  undefined2 uStack_6cb;
  char *local_6c0;
  int local_6b8;
  _Bool local_6b4;
  byte local_6b3;
  undefined8 *local_6b0;
  long local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  long local_680;
  int *local_678;
  long local_670;
  int local_668;
  int local_664;
  int local_660;
  long local_658;
  byte *local_650;
  long local_648;
  _Bool local_640;
  _Bool local_63f;
  _Bool local_63e;
  undefined1 local_63d;
  long local_638;
  long *local_630;
  long local_628;
  long local_620;
  char *local_618;
  long local_610;
  char *local_608;
  long local_600;
  char *local_5f8;
  long local_5e0;
  undefined1 local_5d8 [192];
  JlMarshallElement local_518;
  undefined8 local_4b8;
  char *pcStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined4 local_458;
  char *local_450;
  undefined1 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined4 local_410;
  undefined2 local_40c;
  undefined8 local_408;
  undefined4 local_400;
  undefined4 local_3f8;
  char *local_3f0;
  undefined1 local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined6 uStack_3b8;
  undefined2 uStack_3b2;
  undefined6 uStack_3b0;
  undefined8 local_3a8;
  undefined4 local_3a0;
  undefined4 local_398;
  char *local_390;
  undefined1 local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined6 uStack_358;
  undefined2 uStack_352;
  undefined6 uStack_350;
  undefined8 local_348;
  undefined4 local_340;
  undefined4 local_338;
  char *local_330;
  undefined1 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  undefined2 local_2ec;
  undefined8 local_2e8;
  undefined4 local_2e0;
  undefined4 local_2d8;
  char *local_2d0;
  undefined1 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  undefined2 local_28c;
  undefined8 local_288;
  undefined4 local_280;
  undefined4 local_278;
  char *local_270;
  undefined1 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined4 local_230;
  undefined2 local_22c;
  undefined8 local_228;
  undefined4 local_220;
  undefined4 local_218;
  char *local_210;
  undefined1 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined2 local_1cc;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined4 local_1b8;
  char *local_1b0;
  undefined1 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined4 local_170;
  undefined2 local_16c;
  undefined8 local_168;
  undefined4 local_160;
  undefined4 local_158;
  char *local_150;
  undefined1 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined4 local_110;
  undefined2 local_10c;
  undefined8 local_108;
  undefined4 local_100;
  undefined4 local_f8;
  char *local_f0;
  undefined1 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined2 local_ac;
  undefined1 *local_a8;
  undefined4 local_a0;
  undefined4 local_98;
  char *local_90;
  undefined1 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined2 local_4c;
  undefined1 *local_48;
  undefined4 local_40;
  
  local_6f8 = 0;
  memcpy(local_5d8,&DAT_001416b0,0xc0);
  local_518.Type = JL_DATA_TYPE_STRING;
  local_518.Name = "FixStr";
  local_518.IsArray = false;
  local_518.FieldOffset = 0;
  local_518.FieldSize = 10;
  local_518.ChildStructDescription = (JlMarshallElement *)0x0;
  local_518.ChildStructDescriptionCount = 0;
  local_4a8 = 0;
  local_498 = 0;
  uStack_490 = 0;
  local_488 = 0;
  uStack_480 = 0;
  local_478 = 0;
  uStack_470 = 0;
  local_468 = 0;
  uStack_460 = 0;
  local_518.CountFieldOffset = 0;
  local_518.CountFieldSize = 0;
  local_518.ArrayFieldSize = 0;
  local_518.ArrayItemSize._0_6_ = 0;
  local_518.ArrayItemSize._6_2_ = 0;
  local_518.NumberType = JL_NUM_TYPE_NONE;
  local_518.IsHex = false;
  local_518.IsBase64 = false;
  local_4b8 = 1;
  pcStack_4b0 = "VarStr";
  uStack_4a0 = 0x10;
  local_458 = 2;
  local_450 = "Num";
  local_448 = 0;
  local_440 = 0x18;
  local_438 = 4;
  local_420 = 0;
  uStack_418 = 0;
  local_430 = 0;
  uStack_428 = 0;
  local_410 = 10;
  local_40c = 0;
  local_408 = 0;
  local_400 = 0;
  local_3f8 = 3;
  local_3f0 = "Bool1";
  local_3e8 = 0;
  local_3e0 = 0x1c;
  local_3d8 = 1;
  local_3a8 = 0;
  local_3a0 = 0;
  uStack_3b0 = 0;
  local_3c0 = 0;
  uStack_3b8 = 0;
  uStack_3b2 = 0;
  local_3d0 = 0;
  uStack_3c8 = 0;
  local_398 = 3;
  local_390 = "Bool2";
  local_388 = 0;
  local_380 = 0x1d;
  local_378 = 1;
  local_348 = 0;
  local_340 = 0;
  uStack_350 = 0;
  local_360 = 0;
  uStack_358 = 0;
  uStack_352 = 0;
  local_370 = 0;
  uStack_368 = 0;
  local_338 = 1;
  local_330 = "StrVarList";
  local_328 = 1;
  local_320 = 0x20;
  local_318 = 0;
  local_310 = 0x28;
  local_308 = 8;
  local_300 = 0;
  local_2f8 = 8;
  local_2f0 = 0;
  local_2ec = 0;
  local_2e8 = 0;
  local_2e0 = 0;
  local_2d8 = 1;
  local_2d0 = "StrFixList";
  local_2c8 = 1;
  local_2c0 = 0x30;
  local_2b8 = 0;
  local_2b0 = 0x50;
  local_2a8 = 8;
  local_2a0 = 0x20;
  lVar11 = 0;
  local_298 = 8;
  local_290 = 0;
  local_28c = 0;
  local_288 = 0;
  local_280 = 0;
  local_278 = 2;
  local_270 = "NumVarList";
  local_268 = 1;
  local_260 = 0x58;
  local_258 = 4;
  local_250 = 0x60;
  local_248 = 8;
  local_240 = 0;
  local_238 = 4;
  local_230 = 10;
  local_22c = 0;
  local_228 = 0;
  local_220 = 0;
  local_218 = 2;
  local_210 = "NumFixList";
  local_208 = 1;
  local_200 = 0x68;
  local_1f8 = 4;
  local_1f0 = 0x78;
  local_1e8 = 8;
  local_1e0 = 0x10;
  local_1d8 = 4;
  local_1d0 = 10;
  local_1cc = 0;
  local_1c8 = 0;
  local_1c0 = 0;
  local_1b8 = 3;
  local_1b0 = "BoolVarList";
  local_1a8 = 1;
  local_1a0 = 0x80;
  local_198 = 1;
  local_190 = 0x88;
  local_188 = 8;
  local_180 = 0;
  local_178 = 1;
  local_170 = 0;
  local_16c = 0;
  local_168 = 0;
  local_160 = 0;
  local_158 = 3;
  local_150 = "BoolFixList";
  local_148 = 1;
  local_140 = 0x90;
  local_138 = 1;
  local_130 = 0x98;
  local_128 = 8;
  local_120 = 4;
  local_118 = 1;
  local_110 = 0;
  local_10c = 0;
  local_108 = 0;
  local_100 = 0;
  local_f8 = 5;
  local_f0 = "MiniVarList";
  local_e8 = 1;
  local_e0 = 0xa0;
  local_d8 = 8;
  local_d0 = 0xa8;
  local_c8 = 8;
  local_c0 = 0;
  local_b8 = 0x10;
  local_b0 = 0;
  local_ac = 0;
  local_a0 = 2;
  local_98 = 5;
  local_90 = "MiniFixList";
  local_88 = 1;
  local_80 = 0xb0;
  local_78 = 0x40;
  local_70 = 0xf0;
  local_68 = 8;
  local_60 = 0x40;
  local_58 = 0x10;
  local_50 = 0;
  local_4c = 0;
  local_40 = 2;
  WVar12 = WJTL_STATUS_SUCCESS;
  local_a8 = local_5d8;
  local_48 = local_5d8;
  do {
    memset(&local_6d0,0,0xf8);
    JVar7 = JlJsonToStruct("{ \"FixStr\":\"FixStr\", \"VarStr\":\"VarStr\", \"Num\":1234, \"Bool1\":true, \"Bool2\":false, \"StrVarList\":[\"StrVarList1\",\"StrVarList2\"], \"StrFixList\":[\"StrFixList1\",\"StrFixList2\"], \"NumVarList\":[101,102], \"NumFixList\":[201,202], \"BoolVarList\":[true,false,true], \"BoolFixList\":[true,false,true], \"MiniVarList\": [ {\"XNum\":301,\"XStr\":\"301\"}, {\"XNum\":401,\"XStr\":\"401\"} ], \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"} ] }"
                           ,&local_518,0xd,&local_6d0,&local_6f8);
    WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlJsonToStruct( \"{ \\\"FixStr\\\":\\\"FixStr\\\", \\\"VarStr\\\":\\\"VarStr\\\", \\\"Num\\\":1234, \\\"Bool1\\\":true, \\\"Bool2\\\":false,\" \" \\\"StrVarList\\\":[\\\"StrVarList1\\\",\\\"StrVarList2\\\"], \\\"StrFixList\\\":[\\\"StrFixList1\\\",\\\"StrFixList2\\\"],\" \" \\\"NumVarList\\\":[101,102], \\\"NumFixList\\\":[201,202], \\\"BoolVarList\\\":[true,false,true],\" \" \\\"BoolFixList\\\":[true,false,true],\" \" \\\"MiniVarList\\\": [ {\\\"XNum\\\":301,\\\"XStr\\\":\\\"301\\\"}, {\\\"XNum\\\":401,\\\"XStr\\\":\\\"401\\\"} ],\" \" \\\"MiniFixList\\\": [ {\\\"XNum\\\":501,\\\"XStr\\\":\\\"501\\\"}, {\\\"XNum\\\":601,\\\"XStr\\\":\\\"601\\\"} ] }\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",0x486);
    if (local_6f8 != 0) {
      WVar12 = WJTL_STATUS_FAILED;
    }
    if (JVar7 != JL_STATUS_SUCCESS) {
      WVar12 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(local_6f8 == 0,"0 == errorAtPos",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",0x487);
    switch(lVar11) {
    case 0:
      JVar7 = JlJsonToStruct("{\"FixStr\":\"XXXX\"}",&local_518,0xd,&local_6d0,&local_6f8);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"FixStr\\\":\\\"XXXX\\\"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x48c);
      bVar3 = local_6cc == '\0';
      bVar4 = local_6d0 == 0x58585858;
      WjTestLib_Assert(bVar3 && bVar4,"strcmp( theStruct.FixStr, \"XXXX\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x48d);
      if ((!bVar3 || !bVar4) || JVar7 != JL_STATUS_SUCCESS) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      goto LAB_00113ca4;
    case 1:
      JVar7 = JlJsonToStruct("{\"VarStr\":\"XXXX\"}",&local_518,0xd,&local_6d0,&local_6f8);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"VarStr\\\":\\\"XXXX\\\"}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x490);
      iVar9 = strcmp(local_6c0,"XXXX");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.VarStr, \"XXXX\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x491);
      if (iVar9 != 0 || JVar7 != JL_STATUS_SUCCESS) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      goto LAB_00113c60;
    case 2:
      JVar7 = JlJsonToStruct("{\"Num\":9999}",&local_518,0xd,&local_6d0,&local_6f8);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"Num\\\":9999}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x494);
      _Var15 = local_6b8 == 9999;
      if (!_Var15) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (JVar7 != JL_STATUS_SUCCESS) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      pcVar13 = "9999 == theStruct.Num";
      iVar9 = 0x495;
      break;
    case 3:
      JVar7 = JlJsonToStruct("{\"Bool1\":false,\"Bool2\":true}",&local_518,0xd,&local_6d0,&local_6f8
                            );
      if (JVar7 != JL_STATUS_SUCCESS) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"Bool1\\\":false,\\\"Bool2\\\":true}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x498);
      _Var15 = local_6b4;
      WjTestLib_Assert((_Bool)(local_6b4 ^ 1),"!theStruct.Bool1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x499);
      if (_Var15 != false) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      pcVar13 = "theStruct.Bool2";
      iVar9 = 0x49a;
      bVar14 = local_6b3;
      goto LAB_00113c50;
    case 4:
      JVar7 = JlJsonToStruct("{\"StrVarList\":[\"a\",\"b\",\"c\"]}",&local_518,0xd,&local_6d0,
                             &local_6f8);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"StrVarList\\\":[\\\"a\\\",\\\"b\\\",\\\"c\\\"]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x49d);
      local_6f0 = local_6a8;
      WjTestLib_Assert(local_6a8 == 3,"3 == theStruct.StrArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x49e);
      iVar9 = strcmp((char *)*local_6b0,"a");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StrArray[0], \"a\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x49f);
      iVar10 = strcmp((char *)local_6b0[1],"b");
      WjTestLib_Assert(iVar10 == 0,"strcmp( theStruct.StrArray[1], \"b\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a0);
      iVar8 = strcmp((char *)local_6b0[2],"c");
      if (((iVar9 != 0 || JVar7 != JL_STATUS_SUCCESS) || iVar10 != 0) || iVar8 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (local_6f0 != 3) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      _Var15 = iVar8 == 0;
      pcVar13 = "strcmp( theStruct.StrArray[2], \"c\" ) == 0";
      iVar9 = 0x4a1;
      break;
    case 5:
      JVar7 = JlJsonToStruct("{\"StrFixList\":[\"a\",\"b\",\"c\"]}",&local_518,0xd,&local_6d0,
                             &local_6f8);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"StrFixList\\\":[\\\"a\\\",\\\"b\\\",\\\"c\\\"]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a4);
      lVar1 = local_680;
      WjTestLib_Assert(local_680 == 3,"3 == theStruct.StrFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a5);
      iVar9 = strcmp(local_6a0,"a");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StrFixArray[0], \"a\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a6);
      iVar10 = strcmp(local_698,"b");
      WjTestLib_Assert(iVar10 == 0,"strcmp( theStruct.StrFixArray[1], \"b\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4a7);
      iVar8 = strcmp(local_690,"c");
      if (((iVar9 != 0 || JVar7 != JL_STATUS_SUCCESS) || iVar10 != 0) || iVar8 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 3) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      _Var15 = iVar8 == 0;
      pcVar13 = "strcmp( theStruct.StrFixArray[2], \"c\" ) == 0";
      iVar9 = 0x4a8;
      break;
    case 6:
      JVar7 = JlJsonToStruct("{\"NumVarList\":[10,20,30]}",&local_518,0xd,&local_6d0,&local_6f8);
      local_6f0 = CONCAT44(local_6f0._4_4_,JVar7);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"NumVarList\\\":[10,20,30]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ab);
      lVar1 = local_670;
      WjTestLib_Assert(local_670 == 3,"3 == theStruct.NumVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ac);
      iVar9 = *local_678;
      WjTestLib_Assert(iVar9 == 10,"10 == theStruct.NumVarArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ad);
      iVar10 = local_678[1];
      WjTestLib_Assert(iVar10 == 0x14,"20 == theStruct.NumVarArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ae);
      _Var15 = local_678[2] == 0x1e;
      if (!_Var15) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (iVar10 != 0x14) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (iVar9 != 10) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 3) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if ((int)local_6f0 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      pcVar13 = "30 == theStruct.NumVarArray[2]";
      iVar9 = 0x4af;
      break;
    case 7:
      JVar7 = JlJsonToStruct("{\"NumFixList\":[10,20,30]}",&local_518,0xd,&local_6d0,&local_6f8);
      local_6f0 = CONCAT44(local_6f0._4_4_,JVar7);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"NumFixList\\\":[10,20,30]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b2);
      lVar1 = local_658;
      WjTestLib_Assert(local_658 == 3,"3 == theStruct.NumFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b3);
      iVar9 = local_668;
      WjTestLib_Assert(local_668 == 10,"10 == theStruct.NumFixArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b4);
      iVar10 = local_664;
      WjTestLib_Assert(local_664 == 0x14,"20 == theStruct.NumFixArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b5);
      _Var15 = local_660 == 0x1e;
      if (!_Var15) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (iVar10 != 0x14) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (iVar9 != 10) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 3) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if ((int)local_6f0 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      pcVar13 = "30 == theStruct.NumFixArray[2]";
      iVar9 = 0x4b6;
      break;
    case 8:
      JVar7 = JlJsonToStruct("{\"BoolVarList\":[false,true,false,true]}",&local_518,0xd,&local_6d0,
                             &local_6f8);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"BoolVarList\\\":[false,true,false,true]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4b9);
      if (local_648 != 4) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (JVar7 != JL_STATUS_SUCCESS) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(local_648 == 4,"4 == theStruct.BoolVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ba);
      bVar14 = *local_650;
      WjTestLib_Assert((_Bool)(bVar14 ^ 1),"!theStruct.BoolVarArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4bb);
      if (bVar14 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      _Var15 = (_Bool)local_650[1];
      WjTestLib_Assert(_Var15,"theStruct.BoolVarArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4bc);
      if (_Var15 == false) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      bVar14 = local_650[2];
      WjTestLib_Assert((_Bool)(bVar14 ^ 1),"!theStruct.BoolVarArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4bd);
      if (bVar14 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      bVar14 = local_650[3];
      pcVar13 = "theStruct.BoolVarArray[3]";
      iVar9 = 0x4be;
      goto LAB_00113c50;
    case 9:
      JVar7 = JlJsonToStruct("{\"BoolFixList\":[false,true,false,true]}",&local_518,0xd,&local_6d0,
                             &local_6f8);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"BoolFixList\\\":[false,true,false,true]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c1);
      if (local_638 != 4) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (JVar7 != JL_STATUS_SUCCESS) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(local_638 == 4,"4 == theStruct.BoolFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c2);
      _Var15 = local_640;
      WjTestLib_Assert((_Bool)(local_640 ^ 1),"!theStruct.BoolFixArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c3);
      _Var5 = local_63f;
      if (_Var15 != false) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(local_63f,"theStruct.BoolFixArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c4);
      _Var15 = local_63e;
      if (_Var5 == false) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert((_Bool)(local_63e ^ 1),"!theStruct.BoolFixArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c5);
      if (_Var15 != false) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      pcVar13 = "theStruct.BoolFixArray[3]";
      iVar9 = 0x4c6;
      bVar14 = local_63d;
LAB_00113c50:
      WjTestLib_Assert((_Bool)bVar14,pcVar13,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",iVar9);
      if ((_Bool)bVar14 == false) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      goto LAB_00113c60;
    case 10:
      JVar7 = JlJsonToStruct("{\"MiniVarList\": [ {\"XNum\":777,\"XStr\":\"777\"}, {\"XNum\":888,\"XStr\":\"888\"}, {\"XNum\":999,\"XStr\":\"999\"} ]}"
                             ,&local_518,0xd,&local_6d0,&local_6f8);
      local_6f0 = CONCAT44(local_6f0._4_4_,JVar7);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"MiniVarList\\\": [ {\\\"XNum\\\":777,\\\"XStr\\\":\\\"777\\\"}, {\\\"XNum\\\":888,\\\"XStr\\\":\\\"888\\\"}, {\\\"XNum\\\":999,\\\"XStr\\\":\\\"999\\\"} ]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4c9);
      local_6d8 = local_628;
      WjTestLib_Assert(local_628 == 3,"3 == theStruct.StructVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ca);
      local_6e0 = *local_630;
      WjTestLib_Assert(local_6e0 == 0x309,"777 == theStruct.StructVarArray[0].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4cb);
      local_6e4 = strcmp((char *)local_630[1],"777");
      WjTestLib_Assert(local_6e4 == 0,"strcmp( theStruct.StructVarArray[0].XStr, \"777\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4cc);
      lVar1 = local_630[2];
      WjTestLib_Assert(lVar1 == 0x378,"888 == theStruct.StructVarArray[1].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4cd);
      iVar9 = strcmp((char *)local_630[3],"888");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StructVarArray[1].XStr, \"888\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ce);
      lVar2 = local_630[4];
      WjTestLib_Assert(lVar2 == 999,"999 == theStruct.StructVarArray[2].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4cf);
      iVar10 = strcmp((char *)local_630[5],"999");
      _Var15 = iVar10 == 0;
      if (!_Var15) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar2 != 999) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (iVar9 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 0x378) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (local_6e4 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (local_6e0 != 0x309) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (local_6d8 != 3) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if ((int)local_6f0 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      pcVar13 = "strcmp( theStruct.StructVarArray[2].XStr, \"999\" ) == 0";
      iVar9 = 0x4d0;
      break;
    case 0xb:
      JVar7 = JlJsonToStruct("{\"MiniFixList\": [ {\"XNum\":777,\"XStr\":\"777\"}, {\"XNum\":888,\"XStr\":\"888\"}, {\"XNum\":999,\"XStr\":\"999\"} ]}"
                             ,&local_518,0xd,&local_6d0,&local_6f8);
      local_6f0 = CONCAT44(local_6f0._4_4_,JVar7);
      WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlJsonToStruct( \"{\\\"MiniFixList\\\": [ {\\\"XNum\\\":777,\\\"XStr\\\":\\\"777\\\"}, {\\\"XNum\\\":888,\\\"XStr\\\":\\\"888\\\"}, {\\\"XNum\\\":999,\\\"XStr\\\":\\\"999\\\"} ]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d3);
      local_6d8 = local_5e0;
      WjTestLib_Assert(local_5e0 == 3,"3 == theStruct.StructFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d4);
      local_6e0 = local_620;
      WjTestLib_Assert(local_620 == 0x309,"777 == theStruct.StructFixArray[0].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d5);
      local_6e4 = strcmp(local_618,"777");
      WjTestLib_Assert(local_6e4 == 0,"strcmp( theStruct.StructFixArray[0].XStr, \"777\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d6);
      lVar1 = local_610;
      WjTestLib_Assert(local_610 == 0x378,"888 == theStruct.StructFixArray[1].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d7);
      iVar9 = strcmp(local_608,"888");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StructFixArray[1].XStr, \"888\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d8);
      lVar2 = local_600;
      WjTestLib_Assert(local_600 == 999,"999 == theStruct.StructFixArray[2].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4d9);
      iVar10 = strcmp(local_5f8,"999");
      _Var15 = iVar10 == 0;
      if (!_Var15) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar2 != 999) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (iVar9 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 0x378) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (local_6e4 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (local_6e0 != 0x309) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (local_6d8 != 3) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if ((int)local_6f0 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      pcVar13 = "strcmp( theStruct.StructFixArray[2].XStr, \"999\" ) == 0";
      iVar9 = 0x4da;
      break;
    default:
      WjTestLib_Assert(false,"false",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4dd);
      WVar12 = WJTL_STATUS_FAILED;
      goto LAB_00113c60;
    }
    WjTestLib_Assert(_Var15,pcVar13,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",iVar9);
LAB_00113c60:
    bVar3 = CONCAT22(uStack_6cb,CONCAT11(local_6cc,local_6d0._3_1_)) == 0x727453;
    if (!bVar3 || local_6d0 != 0x53786946) {
      WVar12 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(bVar3 && local_6d0 == 0x53786946,"strcmp( theStruct.FixStr, \"FixStr\" ) == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",0x4e2);
    if (lVar11 == 1) {
LAB_00113ce3:
      if (local_6b8 != 0x4d2) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(local_6b8 == 0x4d2,"1234 == theStruct.Num",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4e4);
      if (lVar11 != 3) goto LAB_00113d17;
LAB_00113d77:
      lVar1 = local_6a8;
      WjTestLib_Assert(local_6a8 == 2,"2 == theStruct.StrArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ea);
      iVar9 = strcmp((char *)*local_6b0,"StrVarList1");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StrArray[0], \"StrVarList1\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4eb);
      iVar10 = strcmp((char *)local_6b0[1],"StrVarList2");
      if (iVar9 != 0 || iVar10 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 2) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(iVar10 == 0,"strcmp( theStruct.StrArray[1], \"StrVarList2\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ec);
      if (lVar11 != 5) goto LAB_00113e34;
LAB_00113eed:
      lVar1 = local_670;
      WjTestLib_Assert(local_670 == 2,"2 == theStruct.NumVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f4);
      iVar9 = *local_678;
      WjTestLib_Assert(iVar9 == 0x65,"101 == theStruct.NumVarArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f5);
      if (local_678[1] != 0x66) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (iVar9 != 0x65) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 2) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(local_678[1] == 0x66,"102 == theStruct.NumVarArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f6);
      if (lVar11 != 7) goto LAB_00113fa1;
LAB_00114057:
      lVar1 = local_648;
      WjTestLib_Assert(local_648 == 3,"3 == theStruct.BoolVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4fe);
      if ((_Bool)*local_650 == false) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 3) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert((_Bool)*local_650,"theStruct.BoolVarArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ff);
      bVar14 = local_650[1];
      WjTestLib_Assert((_Bool)(bVar14 ^ 1),"!theStruct.BoolVarArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x500);
      if (bVar14 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      _Var15 = (_Bool)local_650[2];
      WjTestLib_Assert(_Var15,"theStruct.BoolVarArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x501);
      if (_Var15 == false) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar11 != 9) goto LAB_00114120;
LAB_001141de:
      lVar6 = local_628;
      WjTestLib_Assert(local_628 == 2,"2 == theStruct.StructVarArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50a);
      lVar1 = *local_630;
      WjTestLib_Assert(lVar1 == 0x12d,"301 == theStruct.StructVarArray[0].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50b);
      iVar9 = strcmp((char *)local_630[1],"301");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StructVarArray[0].XStr, \"301\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50c);
      lVar2 = local_630[2];
      WjTestLib_Assert(lVar2 == 0x191,"401 == theStruct.StructVarArray[1].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50d);
      iVar10 = strcmp((char *)local_630[3],"401");
      if (iVar10 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar2 != 0x191) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (iVar9 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 0x12d) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar6 != 2) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(iVar10 == 0,"strcmp( theStruct.StructVarArray[1].XStr, \"401\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x50e);
      if (lVar11 != 0xb) goto LAB_00114338;
    }
    else {
LAB_00113ca4:
      iVar9 = strcmp(local_6c0,"VarStr");
      if (iVar9 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.VarStr, \"VarStr\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4e3);
      if (lVar11 != 2) goto LAB_00113ce3;
LAB_00113d17:
      _Var15 = local_6b4;
      WjTestLib_Assert(local_6b4,"theStruct.Bool1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4e6);
      bVar14 = local_6b3;
      if (_Var15 == false) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert((_Bool)(local_6b3 ^ 1),"!theStruct.Bool2",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4e7);
      if (bVar14 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar11 != 4) goto LAB_00113d77;
LAB_00113e34:
      lVar1 = local_680;
      WjTestLib_Assert(local_680 == 2,"2 == theStruct.StrFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4ef);
      iVar9 = strcmp(local_6a0,"StrFixList1");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StrFixArray[0], \"StrFixList1\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f0);
      iVar10 = strcmp(local_698,"StrFixList2");
      if (iVar9 != 0 || iVar10 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 2) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(iVar10 == 0,"strcmp( theStruct.StrFixArray[1], \"StrFixList2\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f1);
      if (lVar11 != 6) goto LAB_00113eed;
LAB_00113fa1:
      lVar1 = local_658;
      WjTestLib_Assert(local_658 == 2,"2 == theStruct.NumFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4f9);
      iVar9 = local_668;
      WjTestLib_Assert(local_668 == 0xc9,"201 == theStruct.NumFixArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4fa);
      if (local_664 != 0xca) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (iVar9 != 0xc9) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 2) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(local_664 == 0xca,"202 == theStruct.NumFixArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x4fb);
      if (lVar11 != 8) goto LAB_00114057;
LAB_00114120:
      lVar1 = local_638;
      WjTestLib_Assert(local_638 == 3,"3 == theStruct.BoolFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x504);
      if (local_640 == false) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 3) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(local_640,"theStruct.BoolFixArray[0]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x505);
      _Var15 = local_63f;
      WjTestLib_Assert((_Bool)(local_63f ^ 1),"!theStruct.BoolFixArray[1]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x506);
      _Var5 = local_63e;
      if (_Var15 != false) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(local_63e,"theStruct.BoolFixArray[2]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x507);
      if (_Var5 == false) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar11 != 10) goto LAB_001141de;
LAB_00114338:
      lVar6 = local_5e0;
      WjTestLib_Assert(local_5e0 == 2,"2 == theStruct.StructFixArrayCount",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x511);
      lVar1 = local_620;
      WjTestLib_Assert(local_620 == 0x1f5,"501 == theStruct.StructFixArray[0].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x512);
      iVar9 = strcmp(local_618,"501");
      WjTestLib_Assert(iVar9 == 0,"strcmp( theStruct.StructFixArray[0].XStr, \"501\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x513);
      lVar2 = local_610;
      WjTestLib_Assert(local_610 == 0x259,"601 == theStruct.StructFixArray[1].XNum",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x514);
      iVar10 = strcmp(local_608,"601");
      if (iVar10 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar2 != 0x259) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (iVar9 != 0) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar1 != 0x1f5) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      if (lVar6 != 2) {
        WVar12 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(iVar10 == 0,"strcmp( theStruct.StructFixArray[1].XStr, \"601\" ) == 0",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                       ,"TestUnmarshallPartialFills",0x515);
    }
    JVar7 = JlUnmarshallFreeStructAllocs(&local_518,0xd,&local_6d0);
    if (JVar7 != JL_STATUS_SUCCESS) {
      WVar12 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(JVar7 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                     ,"TestUnmarshallPartialFills",0x518);
    lVar11 = lVar11 + 1;
    if (lVar11 == 0xc) {
      return WVar12;
    }
  } while( true );
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallPartialFills
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        uint64_t    XNum;
        char*       XStr;
    } MiniStruct;

    typedef struct
    {
        char        FixStr[10];
        char*       VarStr;
        uint32_t    Num;
        bool        Bool1;
        bool        Bool2;
        char**      StrArray;
        size_t      StrArrayCount;
        char*       StrFixArray[4];
        size_t      StrFixArrayCount;
        uint32_t*   NumVarArray;
        size_t      NumVarArrayCount;
        uint32_t    NumFixArray[4];
        size_t      NumFixArrayCount;
        bool*       BoolVarArray;
        size_t      BoolVarArrayCount;
        bool        BoolFixArray[4];
        size_t      BoolFixArrayCount;
        MiniStruct* StructVarArray;
        size_t      StructVarArrayCount;
        MiniStruct  StructFixArray[4];
        size_t      StructFixArrayCount;
    } TheStruct;

    JlMarshallElement marshalMiniStruct[] = {
        JlMarshallUnsigned( MiniStruct, XNum, "XNum" ),
        JlMarshallString( MiniStruct, XStr, "XStr" ),
    };

    JlMarshallElement marshalTheStruct[] = {
        JlMarshallStringFixed( TheStruct, FixStr, "FixStr" ),
        JlMarshallString( TheStruct, VarStr, "VarStr" ),
        JlMarshallUnsigned( TheStruct, Num, "Num" ),
        JlMarshallBool( TheStruct, Bool1, "Bool1" ),
        JlMarshallBool( TheStruct, Bool2, "Bool2" ),
        JlMarshallStringArray( TheStruct, StrArray, StrArrayCount, "StrVarList" ),
        JlMarshallStringFixedArray( TheStruct, StrFixArray, StrFixArrayCount, "StrFixList" ),
        JlMarshallUnsignedArray( TheStruct, NumVarArray, NumVarArrayCount, "NumVarList" ),
        JlMarshallUnsignedFixedArray( TheStruct, NumFixArray, NumFixArrayCount, "NumFixList" ),
        JlMarshallBoolArray( TheStruct, BoolVarArray, BoolVarArrayCount, "BoolVarList" ),
        JlMarshallBoolFixedArray( TheStruct, BoolFixArray, BoolFixArrayCount, "BoolFixList" ),
        JlMarshallStructArray( TheStruct, StructVarArray, StructVarArrayCount, "MiniVarList", MiniStruct, marshalMiniStruct, NumElements(marshalMiniStruct) ),
        JlMarshallStructFixedArray( TheStruct, StructFixArray, StructFixArrayCount, "MiniFixList", MiniStruct, marshalMiniStruct, NumElements(marshalMiniStruct) ),
    };

    // Test replacing each element individually with new json and verify rest of struct does not get changed
    for( size_t element=1; element<=12; element++ )
    {
        TheStruct theStruct = {{0}};

        // Fill in struct with values
        JL_ASSERT_SUCCESS( JlJsonToStruct(
            "{ \"FixStr\":\"FixStr\", \"VarStr\":\"VarStr\", \"Num\":1234, \"Bool1\":true, \"Bool2\":false,"
            " \"StrVarList\":[\"StrVarList1\",\"StrVarList2\"], \"StrFixList\":[\"StrFixList1\",\"StrFixList2\"],"
            " \"NumVarList\":[101,102], \"NumFixList\":[201,202], \"BoolVarList\":[true,false,true],"
            " \"BoolFixList\":[true,false,true],"
            " \"MiniVarList\": [ {\"XNum\":301,\"XStr\":\"301\"}, {\"XNum\":401,\"XStr\":\"401\"} ],"
            " \"MiniFixList\": [ {\"XNum\":501,\"XStr\":\"501\"}, {\"XNum\":601,\"XStr\":\"601\"} ] }",
             marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
        JL_ASSERT( 0 == errorAtPos );

        switch( element )
        {
        case 1:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"FixStr\":\"XXXX\"}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( strcmp( theStruct.FixStr, "XXXX" ) == 0 );
            break;
        case 2:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"VarStr\":\"XXXX\"}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( strcmp( theStruct.VarStr, "XXXX" ) == 0 );
            break;
        case 3:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"Num\":9999}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 9999 == theStruct.Num );
            break;
        case 4:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"Bool1\":false,\"Bool2\":true}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( !theStruct.Bool1 );
            JL_ASSERT( theStruct.Bool2 );
            break;
        case 5:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"StrVarList\":[\"a\",\"b\",\"c\"]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.StrArrayCount );
            JL_ASSERT( strcmp( theStruct.StrArray[0], "a" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrArray[1], "b" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrArray[2], "c" ) == 0 );
            break;
        case 6:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"StrFixList\":[\"a\",\"b\",\"c\"]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.StrFixArrayCount );
            JL_ASSERT( strcmp( theStruct.StrFixArray[0], "a" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrFixArray[1], "b" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrFixArray[2], "c" ) == 0 );
            break;
        case 7:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"NumVarList\":[10,20,30]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.NumVarArrayCount );
            JL_ASSERT( 10 == theStruct.NumVarArray[0] );
            JL_ASSERT( 20 == theStruct.NumVarArray[1] );
            JL_ASSERT( 30 == theStruct.NumVarArray[2] );
            break;
        case 8:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"NumFixList\":[10,20,30]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.NumFixArrayCount );
            JL_ASSERT( 10 == theStruct.NumFixArray[0] );
            JL_ASSERT( 20 == theStruct.NumFixArray[1] );
            JL_ASSERT( 30 == theStruct.NumFixArray[2] );
            break;
        case 9:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"BoolVarList\":[false,true,false,true]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 4 == theStruct.BoolVarArrayCount );
            JL_ASSERT( !theStruct.BoolVarArray[0] );
            JL_ASSERT( theStruct.BoolVarArray[1] );
            JL_ASSERT( !theStruct.BoolVarArray[2] );
            JL_ASSERT( theStruct.BoolVarArray[3] );
            break;
        case 10:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"BoolFixList\":[false,true,false,true]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 4 == theStruct.BoolFixArrayCount );
            JL_ASSERT( !theStruct.BoolFixArray[0] );
            JL_ASSERT( theStruct.BoolFixArray[1] );
            JL_ASSERT( !theStruct.BoolFixArray[2] );
            JL_ASSERT( theStruct.BoolFixArray[3] );
            break;
        case 11:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"MiniVarList\": [ {\"XNum\":777,\"XStr\":\"777\"}, {\"XNum\":888,\"XStr\":\"888\"}, {\"XNum\":999,\"XStr\":\"999\"} ]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.StructVarArrayCount );
            JL_ASSERT( 777 == theStruct.StructVarArray[0].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[0].XStr, "777" ) == 0 );
            JL_ASSERT( 888 == theStruct.StructVarArray[1].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[1].XStr, "888" ) == 0 );
            JL_ASSERT( 999 == theStruct.StructVarArray[2].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[2].XStr, "999" ) == 0 );
            break;
        case 12:
            JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"MiniFixList\": [ {\"XNum\":777,\"XStr\":\"777\"}, {\"XNum\":888,\"XStr\":\"888\"}, {\"XNum\":999,\"XStr\":\"999\"} ]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
            JL_ASSERT( 3 == theStruct.StructFixArrayCount );
            JL_ASSERT( 777 == theStruct.StructFixArray[0].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[0].XStr, "777" ) == 0 );
            JL_ASSERT( 888 == theStruct.StructFixArray[1].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[1].XStr, "888" ) == 0 );
            JL_ASSERT( 999 == theStruct.StructFixArray[2].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[2].XStr, "999" ) == 0 );
            break;
        default:
            JL_ASSERT( false );
            break;
        }

        // Verify every other element is still there
        if( 1 != element ) { JL_ASSERT( strcmp( theStruct.FixStr, "FixStr" ) == 0 ); }
        if( 2 != element ) { JL_ASSERT( strcmp( theStruct.VarStr, "VarStr" ) == 0 ); }
        if( 3 != element ) { JL_ASSERT( 1234 == theStruct.Num ); }
        if( 4 != element ) {
            JL_ASSERT( theStruct.Bool1 );
            JL_ASSERT( !theStruct.Bool2 );
        }
        if( 5 != element ) {
            JL_ASSERT( 2 == theStruct.StrArrayCount );
            JL_ASSERT( strcmp( theStruct.StrArray[0], "StrVarList1" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrArray[1], "StrVarList2" ) == 0 );
        }
        if( 6 != element ) {
            JL_ASSERT( 2 == theStruct.StrFixArrayCount );
            JL_ASSERT( strcmp( theStruct.StrFixArray[0], "StrFixList1" ) == 0 );
            JL_ASSERT( strcmp( theStruct.StrFixArray[1], "StrFixList2" ) == 0 );
        }
        if( 7 != element ) {
            JL_ASSERT( 2 == theStruct.NumVarArrayCount );
            JL_ASSERT( 101 == theStruct.NumVarArray[0] );
            JL_ASSERT( 102 == theStruct.NumVarArray[1] );
        }
        if( 8 != element ) {
            JL_ASSERT( 2 == theStruct.NumFixArrayCount );
            JL_ASSERT( 201 == theStruct.NumFixArray[0] );
            JL_ASSERT( 202 == theStruct.NumFixArray[1] );
        }
        if( 9 != element ) {
            JL_ASSERT( 3 == theStruct.BoolVarArrayCount );
            JL_ASSERT( theStruct.BoolVarArray[0] );
            JL_ASSERT( !theStruct.BoolVarArray[1] );
            JL_ASSERT( theStruct.BoolVarArray[2] );
        }
        if( 10 != element ) {
            JL_ASSERT( 3 == theStruct.BoolFixArrayCount );
            JL_ASSERT( theStruct.BoolFixArray[0] );
            JL_ASSERT( !theStruct.BoolFixArray[1] );
            JL_ASSERT( theStruct.BoolFixArray[2] );
        }
        if( 11 != element ) {
            JL_ASSERT( 2 == theStruct.StructVarArrayCount );
            JL_ASSERT( 301 == theStruct.StructVarArray[0].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[0].XStr, "301" ) == 0 );
            JL_ASSERT( 401 == theStruct.StructVarArray[1].XNum );
            JL_ASSERT( strcmp( theStruct.StructVarArray[1].XStr, "401" ) == 0 );
        }
        if( 12 != element ) {
            JL_ASSERT( 2 == theStruct.StructFixArrayCount );
            JL_ASSERT( 501 == theStruct.StructFixArray[0].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[0].XStr, "501" ) == 0 );
            JL_ASSERT( 601 == theStruct.StructFixArray[1].XNum );
            JL_ASSERT( strcmp( theStruct.StructFixArray[1].XStr, "601" ) == 0 );
        }

        JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTheStruct, NumElements(marshalTheStruct), &theStruct ) );
    }

    return TestReturn;
}